

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_functions.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_dde02::builtin_builder::_isinf(builtin_builder *this,double __value)

{
  byte bVar1;
  ir_variable *var;
  glsl_type *return_type;
  ir_function_signature *piVar2;
  undefined4 extraout_var;
  operand b;
  operand oVar3;
  ir_return *ir;
  ir_constant_data *data;
  glsl_type *in_RSI;
  ulong uVar4;
  ir_factory body;
  operand local_b0;
  ir_constant_data infinities;
  
  var = in_var(&builtins,in_RSI,"x");
  return_type = glsl_type::bvec((uint)in_RSI->vector_elements);
  uVar4 = 0;
  piVar2 = new_sig(&builtins,return_type,(builtin_available_predicate)this,1,var);
  body.instructions = &piVar2->body;
  body.mem_ctx = builtins.mem_ctx;
  piVar2->field_0x48 = piVar2->field_0x48 | 1;
  bVar1 = in_RSI->vector_elements;
  do {
    if (bVar1 <= uVar4) {
      ir_builder::operand::operand(&local_b0,var);
      oVar3.val._0_4_ = ir_builder::abs((int)local_b0.val);
      oVar3.val._4_4_ = extraout_var;
      b.val = &imm((builtin_builder *)in_RSI,(glsl_type *)&infinities,data)->super_ir_rvalue;
      oVar3.val = &ir_builder::equal(oVar3,b)->super_ir_rvalue;
      ir = ir_builder::ret(oVar3);
      ir_builder::ir_factory::emit(&body,(ir_instruction *)ir);
      return (int)piVar2;
    }
    if (in_RSI->field_0x4 == '\x04') {
      *(undefined8 *)((long)&infinities + uVar4 * 8) = 0x7ff0000000000000;
    }
    else {
      if (in_RSI->field_0x4 != '\x02') {
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/builtin_functions.cpp"
                      ,0x1529,
                      "ir_function_signature *(anonymous namespace)::builtin_builder::_isinf(builtin_available_predicate, const glsl_type *)"
                     );
      }
      *(undefined4 *)((long)&infinities + uVar4 * 4) = 0x7f800000;
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

ir_function_signature *
builtin_builder::_isinf(builtin_available_predicate avail, const glsl_type *type)
{
   ir_variable *x = in_var(type, "x");
   MAKE_SIG(glsl_type::bvec(type->vector_elements), avail, 1, x);

   ir_constant_data infinities;
   for (int i = 0; i < type->vector_elements; i++) {
      switch (type->base_type) {
      case GLSL_TYPE_FLOAT:
         infinities.f[i] = INFINITY;
         break;
      case GLSL_TYPE_DOUBLE:
         infinities.d[i] = INFINITY;
         break;
      default:
         unreachable("unknown type");
      }
   }

   body.emit(ret(equal(abs(x), imm(type, infinities))));

   return sig;
}